

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O1

void __thiscall LibClass::doSomething(LibClass *this)

{
  return;
}

Assistant:

void LibClass::doSomething() {
    for (int i = 0; i < 20; i++) {
        LibInternalClass* temp = new LibInternalClass();
    }
}